

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vint4_sse2.h
# Opt level: O3

void embree::avx512::
     BVHNIntersectorKHybrid<8,_4,_1,_false,_embree::avx512::ArrayIntersectorK_1<4,_embree::avx512::QuadMvIntersectorKMoeller<4,_4,_false>_>,_true>
     ::occludedCoherent(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  RayK<4> *pRVar1;
  RayK<4> *pRVar2;
  uint uVar3;
  undefined4 uVar4;
  AccelData *pAVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined8 uVar20;
  undefined1 auVar21 [16];
  RayK<4> *pRVar22;
  byte bVar23;
  byte bVar24;
  byte bVar25;
  byte bVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  long lVar30;
  RayK<4> *pRVar31;
  ulong uVar32;
  byte bVar33;
  ulong uVar34;
  ulong uVar35;
  bool bVar36;
  ulong uVar37;
  ulong uVar38;
  ulong uVar39;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  vint4 ai;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 in_ZMM0 [64];
  vint4 ai_1;
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [64];
  vint4 ai_3;
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [64];
  float fVar99;
  vint4 bi;
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  int in_XMM4_Da;
  int in_XMM4_Db;
  int in_XMM4_Dc;
  int in_XMM4_Dd;
  float fVar104;
  float fVar107;
  float fVar108;
  vint4 bi_1;
  undefined1 auVar105 [16];
  float fVar109;
  undefined1 auVar106 [16];
  vint4 bi_3;
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [32];
  vint4 ai_2;
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [64];
  vint4 bi_2;
  undefined1 auVar119 [16];
  undefined1 auVar120 [64];
  undefined1 auVar121 [64];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 in_ZMM15 [64];
  undefined1 in_ZMM16 [64];
  undefined1 in_ZMM17 [64];
  undefined1 in_ZMM21 [64];
  undefined1 in_ZMM22 [64];
  vint<4> octant;
  StackItemMaskT<embree::NodeRefPtr<8>_> stack [564];
  uint local_267c;
  float local_2508;
  float fStack_2504;
  float fStack_2500;
  float fStack_24fc;
  float local_24f8;
  float fStack_24f4;
  float fStack_24f0;
  float fStack_24ec;
  uint local_2408 [4];
  undefined1 local_23f8 [16];
  undefined1 local_23e8 [16];
  float local_23d8;
  float fStack_23d4;
  float fStack_23d0;
  float fStack_23cc;
  undefined1 local_23c8 [16];
  undefined1 local_23b8 [16];
  undefined1 local_23a8 [16];
  undefined1 local_2398 [32];
  ulong local_2378 [2];
  RayK<4> local_2368 [9016];
  undefined1 auVar43 [16];
  undefined1 auVar40 [16];
  
  ai.field_0 = in_ZMM0._0_16_;
  auVar122 = vpcmpeqd_avx((undefined1  [16])ai.field_0,(undefined1  [16])ai.field_0);
  uVar38 = vpcmpeqd_avx512vl(auVar122,(undefined1  [16])valid_i->field_0);
  uVar38 = uVar38 & 0xf;
  bVar33 = (byte)uVar38;
  if (bVar33 == 0) {
    return;
  }
  pAVar5 = This->ptr;
  local_23b8 = *(undefined1 (*) [16])ray;
  auVar120 = ZEXT1664(local_23b8);
  local_23c8 = *(undefined1 (*) [16])(ray + 0x10);
  auVar121 = ZEXT1664(local_23c8);
  pRVar22 = ray + 0x20;
  uVar20 = *(undefined8 *)pRVar22;
  fStack_23d0 = *(float *)(ray + 0x28);
  fStack_23cc = *(float *)(ray + 0x2c);
  auVar21 = *(undefined1 (*) [16])pRVar22;
  auVar45 = *(undefined1 (*) [16])(ray + 0x40);
  auVar51._8_4_ = 0x7fffffff;
  auVar51._0_8_ = 0x7fffffff7fffffff;
  auVar51._12_4_ = 0x7fffffff;
  auVar40 = vandps_avx(auVar51,auVar45);
  auVar57._8_4_ = 0x219392ef;
  auVar57._0_8_ = 0x219392ef219392ef;
  auVar57._12_4_ = 0x219392ef;
  uVar39 = vcmpps_avx512vl(auVar40,auVar57,1);
  auVar40 = vblendmps_avx512vl(auVar45,auVar57);
  bVar36 = (bool)((byte)uVar39 & 1);
  auVar41._0_4_ = (uint)bVar36 * auVar40._0_4_ | (uint)!bVar36 * in_XMM4_Da;
  bVar36 = (bool)((byte)(uVar39 >> 1) & 1);
  auVar41._4_4_ = (uint)bVar36 * auVar40._4_4_ | (uint)!bVar36 * in_XMM4_Db;
  bVar36 = (bool)((byte)(uVar39 >> 2) & 1);
  auVar41._8_4_ = (uint)bVar36 * auVar40._8_4_ | (uint)!bVar36 * in_XMM4_Dc;
  bVar36 = (bool)((byte)(uVar39 >> 3) & 1);
  auVar41._12_4_ = (uint)bVar36 * auVar40._12_4_ | (uint)!bVar36 * in_XMM4_Dd;
  auVar40 = *(undefined1 (*) [16])(ray + 0x50);
  auVar44 = vandps_avx(auVar51,auVar40);
  uVar39 = vcmpps_avx512vl(auVar44,auVar57,1);
  auVar46 = *(undefined1 (*) [16])(ray + 0x60);
  auVar42 = vblendmps_avx512vl(auVar40,auVar57);
  bVar36 = (bool)((byte)uVar39 & 1);
  auVar43._0_4_ = (uint)bVar36 * auVar42._0_4_ | (uint)!bVar36 * auVar44._0_4_;
  bVar36 = (bool)((byte)(uVar39 >> 1) & 1);
  auVar43._4_4_ = (uint)bVar36 * auVar42._4_4_ | (uint)!bVar36 * auVar44._4_4_;
  bVar36 = (bool)((byte)(uVar39 >> 2) & 1);
  auVar43._8_4_ = (uint)bVar36 * auVar42._8_4_ | (uint)!bVar36 * auVar44._8_4_;
  bVar36 = (bool)((byte)(uVar39 >> 3) & 1);
  auVar43._12_4_ = (uint)bVar36 * auVar42._12_4_ | (uint)!bVar36 * auVar44._12_4_;
  auVar44 = vandps_avx(auVar51,auVar46);
  uVar39 = vcmpps_avx512vl(auVar44,auVar57,1);
  auVar44 = vblendmps_avx512vl(auVar46,auVar57);
  bVar36 = (bool)((byte)uVar39 & 1);
  auVar49._0_4_ = (uint)bVar36 * auVar44._0_4_ | (uint)!bVar36 * 0x219392ef;
  bVar36 = (bool)((byte)(uVar39 >> 1) & 1);
  auVar49._4_4_ = (uint)bVar36 * auVar44._4_4_ | (uint)!bVar36 * 0x219392ef;
  bVar36 = (bool)((byte)(uVar39 >> 2) & 1);
  auVar49._8_4_ = (uint)bVar36 * auVar44._8_4_ | (uint)!bVar36 * 0x219392ef;
  bVar36 = (bool)((byte)(uVar39 >> 3) & 1);
  auVar49._12_4_ = (uint)bVar36 * auVar44._12_4_ | (uint)!bVar36 * 0x219392ef;
  auVar42 = vrcp14ps_avx512vl(auVar41);
  auVar57 = ZEXT816(0) << 0x40;
  auVar52._8_4_ = 0x3f800000;
  auVar52._0_8_ = 0x3f8000003f800000;
  auVar52._12_4_ = 0x3f800000;
  auVar118 = ZEXT1664(auVar52);
  auVar44 = vfnmadd213ps_fma(auVar41,auVar42,auVar52);
  auVar44 = vfmadd132ps_fma(auVar44,auVar42,auVar42);
  auVar42 = vrcp14ps_avx512vl(auVar43);
  auVar41 = vfnmadd213ps_fma(auVar43,auVar42,auVar52);
  auVar41 = vfmadd132ps_fma(auVar41,auVar42,auVar42);
  auVar42 = vrcp14ps_avx512vl(auVar49);
  auVar43 = vfnmadd213ps_fma(auVar49,auVar42,auVar52);
  auVar43 = vfmadd132ps_fma(auVar43,auVar42,auVar42);
  local_23e8 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar57);
  local_23f8 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar57);
  auVar45 = vcmpps_avx(auVar45,auVar57,1);
  auVar42._8_4_ = 1;
  auVar42._0_8_ = 0x100000001;
  auVar42._12_4_ = 1;
  auVar42 = vandps_avx512vl(auVar45,auVar42);
  uVar28 = uVar38 ^ 0xf;
  uVar39 = vcmpps_avx512vl(auVar40,auVar57,1);
  auVar50._8_4_ = 2;
  auVar50._0_8_ = 0x200000002;
  auVar50._12_4_ = 2;
  auVar45 = vpsubd_avx512vl(auVar50,auVar45);
  bVar36 = (bool)((byte)uVar39 & 1);
  auVar40._0_4_ = (uint)bVar36 * auVar45._0_4_ | (uint)!bVar36 * auVar42._0_4_;
  bVar36 = (bool)((byte)(uVar39 >> 1) & 1);
  auVar40._4_4_ = (uint)bVar36 * auVar45._4_4_ | (uint)!bVar36 * auVar42._4_4_;
  bVar36 = (bool)((byte)(uVar39 >> 2) & 1);
  auVar40._8_4_ = (uint)bVar36 * auVar45._8_4_ | (uint)!bVar36 * auVar42._8_4_;
  bVar36 = (bool)((byte)(uVar39 >> 3) & 1);
  auVar40._12_4_ = (uint)bVar36 * auVar45._12_4_ | (uint)!bVar36 * auVar42._12_4_;
  uVar39 = vcmpps_avx512vl(auVar46,auVar57,1);
  auVar45._8_4_ = 4;
  auVar45._0_8_ = 0x400000004;
  auVar45._12_4_ = 4;
  auVar45 = vpord_avx512vl(auVar40,auVar45);
  bVar36 = (bool)((byte)uVar39 & 1);
  auVar46._0_4_ = (uint)bVar36 * auVar45._0_4_ | !bVar36 * auVar40._0_4_;
  bVar36 = (bool)((byte)(uVar39 >> 1) & 1);
  auVar46._4_4_ = (uint)bVar36 * auVar45._4_4_ | !bVar36 * auVar40._4_4_;
  bVar36 = (bool)((byte)(uVar39 >> 2) & 1);
  auVar46._8_4_ = (uint)bVar36 * auVar45._8_4_ | !bVar36 * auVar40._8_4_;
  bVar36 = (bool)((byte)(uVar39 >> 3) & 1);
  auVar46._12_4_ = (uint)bVar36 * auVar45._12_4_ | !bVar36 * auVar40._12_4_;
  auVar98 = ZEXT1664(auVar46);
  auVar45 = vmovdqa32_avx512vl(auVar46);
  local_2408[0] = (uint)(bVar33 & 1) * auVar45._0_4_ | (uint)!(bool)(bVar33 & 1) * auVar122._0_4_;
  bVar36 = (bool)((byte)(uVar38 >> 1) & 1);
  local_2408[1] = (uint)bVar36 * auVar45._4_4_ | (uint)!bVar36 * auVar122._4_4_;
  bVar36 = (bool)((byte)(uVar38 >> 2) & 1);
  local_2408[2] = (uint)bVar36 * auVar45._8_4_ | (uint)!bVar36 * auVar122._8_4_;
  bVar36 = SUB81(uVar38 >> 3,0);
  local_2408[3] = (uint)bVar36 * auVar45._12_4_ | (uint)!bVar36 * auVar122._12_4_;
  auVar92 = ZEXT1664(CONCAT412(0x80000000,CONCAT48(0x80000000,0x8000000080000000)));
  auVar122._0_4_ = auVar44._0_4_ * -local_23b8._0_4_;
  auVar122._4_4_ = auVar44._4_4_ * -local_23b8._4_4_;
  auVar122._8_4_ = auVar44._8_4_ * -local_23b8._8_4_;
  auVar122._12_4_ = auVar44._12_4_ * -local_23b8._12_4_;
  auVar123._0_4_ = auVar41._0_4_ * -local_23c8._0_4_;
  auVar123._4_4_ = auVar41._4_4_ * -local_23c8._4_4_;
  auVar123._8_4_ = auVar41._8_4_ * -local_23c8._8_4_;
  auVar123._12_4_ = auVar41._12_4_ * -local_23c8._12_4_;
  local_23d8 = *(float *)pRVar22;
  fStack_23d4 = *(float *)(ray + 0x24);
  auVar124._0_4_ = auVar43._0_4_ * -*(float *)pRVar22;
  auVar124._4_4_ = auVar43._4_4_ * -*(float *)(ray + 0x24);
  auVar124._8_4_ = auVar43._8_4_ * -fStack_23d0;
  auVar124._12_4_ = auVar43._12_4_ * -fStack_23cc;
  pRVar22 = ray;
LAB_00798c3a:
  lVar30 = 0;
  for (uVar39 = uVar38; (uVar39 & 1) == 0; uVar39 = uVar39 >> 1 | 0x8000000000000000) {
    lVar30 = lVar30 + 1;
  }
  uVar3 = local_2408[lVar30];
  auVar85._4_4_ = uVar3;
  auVar85._0_4_ = uVar3;
  auVar85._8_4_ = uVar3;
  auVar85._12_4_ = uVar3;
  auVar54._4_4_ = local_2408[1];
  auVar54._0_4_ = local_2408[0];
  auVar54._8_4_ = local_2408[2];
  auVar54._12_4_ = local_2408[3];
  uVar39 = vpcmpeqd_avx512vl(auVar85,auVar54);
  uVar39 = uVar39 & 0xf;
  bVar26 = (byte)uVar39;
  local_2378[1] = CONCAT44((int)((ulong)pRVar22 >> 0x20),(uint)bVar26);
  auVar45 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
  auVar40 = vblendmps_avx512vl(auVar45,local_23b8);
  auVar55._0_4_ = (uint)(bVar26 & 1) * auVar40._0_4_ | !(bool)(bVar26 & 1) * uVar3;
  bVar36 = (bool)((byte)(uVar39 >> 1) & 1);
  auVar55._4_4_ = (uint)bVar36 * auVar40._4_4_ | !bVar36 * uVar3;
  bVar36 = (bool)((byte)(uVar39 >> 2) & 1);
  auVar55._8_4_ = (uint)bVar36 * auVar40._8_4_ | !bVar36 * uVar3;
  bVar36 = SUB81(uVar39 >> 3,0);
  auVar55._12_4_ = (uint)bVar36 * auVar40._12_4_ | !bVar36 * uVar3;
  auVar40 = vblendmps_avx512vl(auVar45,local_23c8);
  auVar58._0_4_ = (uint)(bVar26 & 1) * auVar40._0_4_ | (uint)!(bool)(bVar26 & 1) * auVar92._0_4_;
  bVar36 = (bool)((byte)(uVar39 >> 1) & 1);
  auVar58._4_4_ = (uint)bVar36 * auVar40._4_4_ | (uint)!bVar36 * auVar92._4_4_;
  bVar36 = (bool)((byte)(uVar39 >> 2) & 1);
  auVar58._8_4_ = (uint)bVar36 * auVar40._8_4_ | (uint)!bVar36 * auVar92._8_4_;
  bVar36 = SUB81(uVar39 >> 3,0);
  auVar58._12_4_ = (uint)bVar36 * auVar40._12_4_ | (uint)!bVar36 * auVar92._12_4_;
  auVar40 = vblendmps_avx512vl(auVar45,auVar21);
  auVar59._0_4_ = (uint)(bVar26 & 1) * auVar40._0_4_ | (uint)!(bool)(bVar26 & 1) * auVar98._0_4_;
  bVar36 = (bool)((byte)(uVar39 >> 1) & 1);
  auVar59._4_4_ = (uint)bVar36 * auVar40._4_4_ | (uint)!bVar36 * auVar98._4_4_;
  bVar36 = (bool)((byte)(uVar39 >> 2) & 1);
  auVar59._8_4_ = (uint)bVar36 * auVar40._8_4_ | (uint)!bVar36 * auVar98._8_4_;
  bVar36 = SUB81(uVar39 >> 3,0);
  auVar59._12_4_ = (uint)bVar36 * auVar40._12_4_ | (uint)!bVar36 * auVar98._12_4_;
  auVar40 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
  auVar46 = vblendmps_avx512vl(auVar40,local_23b8);
  auVar60._0_4_ =
       (uint)(bVar26 & 1) * auVar46._0_4_ | (uint)!(bool)(bVar26 & 1) * (int)local_23b8._0_4_;
  bVar36 = (bool)((byte)(uVar39 >> 1) & 1);
  auVar60._4_4_ = (uint)bVar36 * auVar46._4_4_ | (uint)!bVar36 * (int)local_23b8._4_4_;
  bVar36 = (bool)((byte)(uVar39 >> 2) & 1);
  auVar60._8_4_ = (uint)bVar36 * auVar46._8_4_ | (uint)!bVar36 * (int)local_23b8._8_4_;
  bVar36 = SUB81(uVar39 >> 3,0);
  auVar60._12_4_ = (uint)bVar36 * auVar46._12_4_ | (uint)!bVar36 * (int)local_23b8._12_4_;
  auVar46 = vblendmps_avx512vl(auVar40,local_23c8);
  auVar61._0_4_ =
       (uint)(bVar26 & 1) * auVar46._0_4_ | (uint)!(bool)(bVar26 & 1) * (int)local_23c8._0_4_;
  bVar36 = (bool)((byte)(uVar39 >> 1) & 1);
  auVar61._4_4_ = (uint)bVar36 * auVar46._4_4_ | (uint)!bVar36 * (int)local_23c8._4_4_;
  bVar36 = (bool)((byte)(uVar39 >> 2) & 1);
  auVar61._8_4_ = (uint)bVar36 * auVar46._8_4_ | (uint)!bVar36 * (int)local_23c8._8_4_;
  bVar36 = SUB81(uVar39 >> 3,0);
  auVar61._12_4_ = (uint)bVar36 * auVar46._12_4_ | (uint)!bVar36 * (int)local_23c8._12_4_;
  auVar46 = vblendmps_avx512vl(auVar40,auVar21);
  auVar62._0_4_ = (uint)(bVar26 & 1) * auVar46._0_4_ | (uint)!(bool)(bVar26 & 1) * (int)uVar20;
  bVar36 = (bool)((byte)(uVar39 >> 1) & 1);
  auVar62._4_4_ = (uint)bVar36 * auVar46._4_4_ | (uint)!bVar36 * (int)((ulong)uVar20 >> 0x20);
  bVar36 = (bool)((byte)(uVar39 >> 2) & 1);
  auVar62._8_4_ = (uint)bVar36 * auVar46._8_4_ | (uint)!bVar36 * (int)fStack_23d0;
  bVar36 = SUB81(uVar39 >> 3,0);
  auVar62._12_4_ = (uint)bVar36 * auVar46._12_4_ | (uint)!bVar36 * (int)fStack_23cc;
  auVar46 = vblendmps_avx512vl(auVar45,auVar44);
  auVar63._0_4_ = (uint)(bVar26 & 1) * auVar46._0_4_ | (uint)!(bool)(bVar26 & 1) * auVar118._0_4_;
  bVar36 = (bool)((byte)(uVar39 >> 1) & 1);
  auVar63._4_4_ = (uint)bVar36 * auVar46._4_4_ | (uint)!bVar36 * auVar118._4_4_;
  bVar36 = (bool)((byte)(uVar39 >> 2) & 1);
  auVar63._8_4_ = (uint)bVar36 * auVar46._8_4_ | (uint)!bVar36 * auVar118._8_4_;
  bVar36 = SUB81(uVar39 >> 3,0);
  auVar63._12_4_ = (uint)bVar36 * auVar46._12_4_ | (uint)!bVar36 * auVar118._12_4_;
  auVar46 = vblendmps_avx512vl(auVar45,auVar41);
  auVar64._0_4_ = (uint)(bVar26 & 1) * auVar46._0_4_ | (uint)!(bool)(bVar26 & 1) * auVar120._0_4_;
  bVar36 = (bool)((byte)(uVar39 >> 1) & 1);
  auVar64._4_4_ = (uint)bVar36 * auVar46._4_4_ | (uint)!bVar36 * auVar120._4_4_;
  bVar36 = (bool)((byte)(uVar39 >> 2) & 1);
  auVar64._8_4_ = (uint)bVar36 * auVar46._8_4_ | (uint)!bVar36 * auVar120._8_4_;
  bVar36 = SUB81(uVar39 >> 3,0);
  auVar64._12_4_ = (uint)bVar36 * auVar46._12_4_ | (uint)!bVar36 * auVar120._12_4_;
  auVar46 = vblendmps_avx512vl(auVar45,auVar43);
  auVar65._0_4_ = (uint)(bVar26 & 1) * auVar46._0_4_ | (uint)!(bool)(bVar26 & 1) * auVar121._0_4_;
  bVar36 = (bool)((byte)(uVar39 >> 1) & 1);
  auVar65._4_4_ = (uint)bVar36 * auVar46._4_4_ | (uint)!bVar36 * auVar121._4_4_;
  bVar36 = (bool)((byte)(uVar39 >> 2) & 1);
  auVar65._8_4_ = (uint)bVar36 * auVar46._8_4_ | (uint)!bVar36 * auVar121._8_4_;
  bVar36 = SUB81(uVar39 >> 3,0);
  auVar65._12_4_ = (uint)bVar36 * auVar46._12_4_ | (uint)!bVar36 * auVar121._12_4_;
  auVar46 = vblendmps_avx512vl(auVar40,auVar44);
  auVar66._0_4_ = (uint)(bVar26 & 1) * auVar46._0_4_ | (uint)!(bool)(bVar26 & 1) * in_ZMM15._0_4_;
  bVar36 = (bool)((byte)(uVar39 >> 1) & 1);
  auVar66._4_4_ = (uint)bVar36 * auVar46._4_4_ | (uint)!bVar36 * in_ZMM15._4_4_;
  bVar36 = (bool)((byte)(uVar39 >> 2) & 1);
  auVar66._8_4_ = (uint)bVar36 * auVar46._8_4_ | (uint)!bVar36 * in_ZMM15._8_4_;
  bVar36 = SUB81(uVar39 >> 3,0);
  auVar66._12_4_ = (uint)bVar36 * auVar46._12_4_ | (uint)!bVar36 * in_ZMM15._12_4_;
  auVar46 = vblendmps_avx512vl(auVar40,auVar41);
  auVar67._0_4_ = (uint)(bVar26 & 1) * auVar46._0_4_ | (uint)!(bool)(bVar26 & 1) * in_ZMM16._0_4_;
  bVar36 = (bool)((byte)(uVar39 >> 1) & 1);
  auVar67._4_4_ = (uint)bVar36 * auVar46._4_4_ | (uint)!bVar36 * in_ZMM16._4_4_;
  bVar36 = (bool)((byte)(uVar39 >> 2) & 1);
  auVar67._8_4_ = (uint)bVar36 * auVar46._8_4_ | (uint)!bVar36 * in_ZMM16._8_4_;
  bVar36 = SUB81(uVar39 >> 3,0);
  auVar67._12_4_ = (uint)bVar36 * auVar46._12_4_ | (uint)!bVar36 * in_ZMM16._12_4_;
  auVar46 = vblendmps_avx512vl(auVar40,auVar43);
  auVar68._0_4_ = (uint)(bVar26 & 1) * auVar46._0_4_ | (uint)!(bool)(bVar26 & 1) * in_ZMM17._0_4_;
  bVar36 = (bool)((byte)(uVar39 >> 1) & 1);
  auVar68._4_4_ = (uint)bVar36 * auVar46._4_4_ | (uint)!bVar36 * in_ZMM17._4_4_;
  bVar36 = (bool)((byte)(uVar39 >> 2) & 1);
  auVar68._8_4_ = (uint)bVar36 * auVar46._8_4_ | (uint)!bVar36 * in_ZMM17._8_4_;
  bVar36 = SUB81(uVar39 >> 3,0);
  auVar68._12_4_ = (uint)bVar36 * auVar46._12_4_ | (uint)!bVar36 * in_ZMM17._12_4_;
  auVar46 = vblendmps_avx512vl(auVar45,local_23e8);
  auVar69._0_4_ = (uint)(bVar26 & 1) * auVar46._0_4_ | (uint)!(bool)(bVar26 & 1) * auVar45._0_4_;
  bVar36 = (bool)((byte)(uVar39 >> 1) & 1);
  auVar69._4_4_ = (uint)bVar36 * auVar46._4_4_ | (uint)!bVar36 * auVar45._4_4_;
  bVar36 = (bool)((byte)(uVar39 >> 2) & 1);
  auVar69._8_4_ = (uint)bVar36 * auVar46._8_4_ | (uint)!bVar36 * auVar45._8_4_;
  bVar36 = SUB81(uVar39 >> 3,0);
  auVar69._12_4_ = (uint)bVar36 * auVar46._12_4_ | (uint)!bVar36 * auVar45._12_4_;
  auVar45 = vblendmps_avx512vl(auVar40,local_23f8);
  auVar47._0_4_ = (uint)(bVar26 & 1) * auVar45._0_4_ | (uint)!(bool)(bVar26 & 1) * in_ZMM21._0_4_;
  bVar36 = (bool)((byte)(uVar39 >> 1) & 1);
  auVar47._4_4_ = (uint)bVar36 * auVar45._4_4_ | (uint)!bVar36 * in_ZMM21._4_4_;
  bVar36 = (bool)((byte)(uVar39 >> 2) & 1);
  auVar47._8_4_ = (uint)bVar36 * auVar45._8_4_ | (uint)!bVar36 * in_ZMM21._8_4_;
  bVar36 = SUB81(uVar39 >> 3,0);
  auVar47._12_4_ = (uint)bVar36 * auVar45._12_4_ | (uint)!bVar36 * in_ZMM21._12_4_;
  in_ZMM21 = ZEXT1664(auVar47);
  auVar45 = vpbroadcastd_avx512vl(ZEXT416(0x7f800000));
  auVar45 = vpblendmd_avx512vl(auVar45,local_23e8);
  auVar48._0_4_ = (uint)(bVar26 & 1) * auVar45._0_4_ | (uint)!(bool)(bVar26 & 1) * in_ZMM22._0_4_;
  bVar36 = (bool)((byte)(uVar39 >> 1) & 1);
  auVar48._4_4_ = (uint)bVar36 * auVar45._4_4_ | (uint)!bVar36 * in_ZMM22._4_4_;
  bVar36 = (bool)((byte)(uVar39 >> 2) & 1);
  auVar48._8_4_ = (uint)bVar36 * auVar45._8_4_ | (uint)!bVar36 * in_ZMM22._8_4_;
  bVar36 = SUB81(uVar39 >> 3,0);
  auVar48._12_4_ = (uint)bVar36 * auVar45._12_4_ | (uint)!bVar36 * in_ZMM22._12_4_;
  in_ZMM22 = ZEXT1664(auVar48);
  local_267c = (uint)uVar39;
  uVar38 = ~local_2378[1] & uVar38;
  auVar45 = vshufps_avx512vl(auVar55,auVar55,0xb1);
  auVar45 = vminps_avx512vl(auVar45,auVar55);
  auVar40 = vshufpd_avx512vl(auVar45,auVar45,1);
  auVar45 = vminps_avx512vl(auVar40,auVar45);
  auVar40 = vshufps_avx512vl(auVar58,auVar58,0xb1);
  auVar40 = vminps_avx512vl(auVar40,auVar58);
  auVar46 = vshufpd_avx512vl(auVar40,auVar40,1);
  auVar40 = vminps_avx512vl(auVar46,auVar40);
  auVar45 = vinsertps_avx(auVar45,auVar40,0x1c);
  auVar40 = vshufps_avx(auVar59,auVar59,0xb1);
  auVar40 = vminps_avx(auVar40,auVar59);
  auVar46 = vshufpd_avx(auVar40,auVar40,1);
  auVar40 = vminps_avx(auVar46,auVar40);
  auVar45 = vinsertps_avx(auVar45,auVar40,0x20);
  auVar40 = vshufps_avx(auVar60,auVar60,0xb1);
  auVar40 = vmaxps_avx(auVar40,auVar60);
  auVar46 = vshufpd_avx(auVar40,auVar40,1);
  auVar40 = vmaxps_avx(auVar46,auVar40);
  auVar46 = vshufps_avx(auVar61,auVar61,0xb1);
  auVar46 = vmaxps_avx(auVar46,auVar61);
  auVar42 = vshufpd_avx(auVar46,auVar46,1);
  auVar46 = vmaxps_avx(auVar42,auVar46);
  auVar40 = vinsertps_avx(auVar40,auVar46,0x1c);
  auVar46 = vshufps_avx(auVar62,auVar62,0xb1);
  auVar46 = vmaxps_avx(auVar46,auVar62);
  auVar42 = vshufpd_avx(auVar46,auVar46,1);
  auVar46 = vmaxps_avx(auVar42,auVar46);
  auVar40 = vinsertps_avx(auVar40,auVar46,0x20);
  auVar46 = vshufps_avx(auVar63,auVar63,0xb1);
  auVar46 = vminps_avx(auVar46,auVar63);
  auVar42 = vshufpd_avx(auVar46,auVar46,1);
  auVar46 = vminps_avx(auVar42,auVar46);
  auVar42 = vshufps_avx(auVar64,auVar64,0xb1);
  auVar42 = vminps_avx(auVar42,auVar64);
  auVar49 = vshufpd_avx(auVar42,auVar42,1);
  auVar42 = vminps_avx(auVar49,auVar42);
  auVar46 = vinsertps_avx(auVar46,auVar42,0x1c);
  auVar42 = vshufps_avx(auVar65,auVar65,0xb1);
  auVar42 = vminps_avx(auVar42,auVar65);
  auVar49 = vshufpd_avx(auVar42,auVar42,1);
  auVar42 = vminps_avx(auVar49,auVar42);
  auVar46 = vinsertps_avx(auVar46,auVar42,0x20);
  auVar42 = vshufps_avx(auVar66,auVar66,0xb1);
  auVar42 = vmaxps_avx(auVar42,auVar66);
  auVar49 = vshufpd_avx(auVar42,auVar42,1);
  auVar42 = vmaxps_avx(auVar49,auVar42);
  auVar49 = vshufps_avx512vl(auVar67,auVar67,0xb1);
  auVar50 = vmaxps_avx512vl(auVar49,auVar67);
  auVar49 = vshufpd_avx(auVar50,auVar50,1);
  auVar49 = vmaxps_avx(auVar49,auVar50);
  auVar42 = vinsertps_avx(auVar42,auVar49,0x1c);
  auVar49 = vshufps_avx512vl(auVar68,auVar68,0xb1);
  auVar50 = vmaxps_avx512vl(auVar49,auVar68);
  auVar49 = vshufpd_avx(auVar50,auVar50,1);
  auVar49 = vmaxps_avx(auVar49,auVar50);
  auVar42 = vinsertps_avx(auVar42,auVar49,0x20);
  auVar49 = vshufps_avx512vl(auVar69,auVar69,0xb1);
  auVar51 = vminps_avx512vl(auVar49,auVar69);
  auVar49 = vshufpd_avx(auVar51,auVar51,1);
  auVar50 = vshufps_avx512vl(auVar47,auVar47,0xb1);
  auVar52 = vmaxps_avx512vl(auVar50,auVar47);
  auVar57 = vshufpd_avx(auVar52,auVar52,1);
  uVar39 = vcmpps_avx512vl(auVar46,ZEXT416(0) << 0x20,5);
  auVar50 = vblendmps_avx512vl(auVar42,auVar46);
  bVar26 = (byte)uVar39;
  fVar107 = (float)((uint)(bVar26 & 1) * auVar50._0_4_);
  fVar104 = (float)((uint)((byte)(uVar39 >> 1) & 1) * auVar50._4_4_);
  auVar53._4_4_ = fVar104;
  auVar53._0_4_ = fVar107;
  fVar109 = (float)((uint)((byte)(uVar39 >> 2) & 1) * auVar50._8_4_);
  auVar53._8_4_ = fVar109;
  fVar108 = (float)((uint)((byte)(uVar39 >> 3) & 1) * auVar50._12_4_);
  auVar53._12_4_ = fVar108;
  vxorps_avx512vl(auVar68,auVar68);
  vucomiss_avx512f(auVar53);
  auVar54 = vblendmps_avx512vl(auVar45,auVar40);
  bVar36 = (bool)((byte)(uVar39 >> 1) & 1);
  bVar8 = (bool)((byte)(uVar39 >> 2) & 1);
  bVar10 = (bool)((byte)(uVar39 >> 3) & 1);
  auVar55 = vmovshdup_avx512vl(auVar53);
  vucomiss_avx512f(auVar55);
  bVar6 = (bool)((byte)(uVar39 >> 1) & 1);
  bVar9 = (bool)((byte)(uVar39 >> 2) & 1);
  bVar11 = (bool)((byte)(uVar39 >> 3) & 1);
  auVar50 = vshufpd_avx(auVar53,auVar53,1);
  vucomiss_avx512f(auVar50);
  auVar50 = vminps_avx(auVar49,auVar51);
  auVar92 = ZEXT1664(auVar50);
  auVar49 = vmaxps_avx(auVar57,auVar52);
  auVar56._0_4_ =
       (float)((uint)(bVar26 & 1) * auVar42._0_4_ | (uint)!(bool)(bVar26 & 1) * auVar46._0_4_);
  bVar7 = (bool)((byte)(uVar39 >> 1) & 1);
  auVar56._4_4_ = (float)((uint)bVar7 * auVar42._4_4_ | (uint)!bVar7 * auVar46._4_4_);
  bVar7 = (bool)((byte)(uVar39 >> 2) & 1);
  auVar56._8_4_ = (float)((uint)bVar7 * auVar42._8_4_ | (uint)!bVar7 * auVar46._8_4_);
  bVar7 = (bool)((byte)(uVar39 >> 3) & 1);
  auVar56._12_4_ = (float)((uint)bVar7 * auVar42._12_4_ | (uint)!bVar7 * auVar46._12_4_);
  fVar99 = (float)((uint)(bVar26 & 1) * auVar54._0_4_ | !(bool)(bVar26 & 1) * auVar66._0_4_) *
           fVar107;
  auVar93._0_4_ =
       (float)((uint)(bVar26 & 1) * auVar45._0_4_ | (uint)!(bool)(bVar26 & 1) * auVar40._0_4_) *
       auVar56._0_4_;
  auVar93._4_4_ =
       (float)((uint)bVar6 * auVar45._4_4_ | (uint)!bVar6 * auVar40._4_4_) * auVar56._4_4_;
  auVar93._8_4_ =
       (float)((uint)bVar9 * auVar45._8_4_ | (uint)!bVar9 * auVar40._8_4_) * auVar56._8_4_;
  auVar93._12_4_ =
       (float)((uint)bVar11 * auVar45._12_4_ | (uint)!bVar11 * auVar40._12_4_) * auVar56._12_4_;
  auVar98 = ZEXT1664(auVar93);
  local_2378[0] = *(undefined8 *)&pAVar5[1].bounds.bounds0.lower.field_0;
  local_2398._4_4_ = fVar107;
  local_2398._0_4_ = fVar107;
  local_2398._8_4_ = fVar107;
  local_2398._12_4_ = fVar107;
  local_2398._16_4_ = fVar107;
  local_2398._20_4_ = fVar107;
  local_2398._24_4_ = fVar107;
  local_2398._28_4_ = fVar107;
  auVar113._4_4_ = fVar99;
  auVar113._0_4_ = fVar99;
  auVar113._8_4_ = fVar99;
  auVar113._12_4_ = fVar99;
  auVar113._16_4_ = fVar99;
  auVar113._20_4_ = fVar99;
  auVar113._24_4_ = fVar99;
  auVar113._28_4_ = fVar99;
  auVar81._8_4_ = 0x80000000;
  auVar81._0_8_ = 0x8000000080000000;
  auVar81._12_4_ = 0x80000000;
  auVar81._16_4_ = 0x80000000;
  auVar81._20_4_ = 0x80000000;
  auVar81._24_4_ = 0x80000000;
  auVar81._28_4_ = 0x80000000;
  auVar118 = ZEXT3264(auVar81);
  auVar70 = vxorps_avx512vl(auVar113,auVar81);
  auVar71 = vbroadcastsd_avx512vl(auVar55);
  auVar77._8_4_ = 1;
  auVar77._0_8_ = 0x100000001;
  auVar77._12_4_ = 1;
  auVar77._16_4_ = 1;
  auVar77._20_4_ = 1;
  auVar77._24_4_ = 1;
  auVar77._28_4_ = 1;
  auVar120 = ZEXT3264(auVar77);
  auVar79 = ZEXT1632(CONCAT412((float)((uint)bVar10 * auVar54._12_4_ | !bVar10 * auVar66._12_4_) *
                               fVar108,CONCAT48((float)((uint)bVar8 * auVar54._8_4_ |
                                                       !bVar8 * auVar66._8_4_) * fVar109,
                                                CONCAT44((float)((uint)bVar36 * auVar54._4_4_ |
                                                                !bVar36 * auVar66._4_4_) * fVar104,
                                                         fVar99))));
  auVar113 = vpermps_avx2(auVar77,auVar79);
  auVar72 = vxorps_avx512vl(auVar113,auVar81);
  auVar80._8_4_ = 2;
  auVar80._0_8_ = 0x200000002;
  auVar80._12_4_ = 2;
  auVar80._16_4_ = 2;
  auVar80._20_4_ = 2;
  auVar80._24_4_ = 2;
  auVar80._28_4_ = 2;
  auVar113 = vpermps_avx2(auVar80,ZEXT1632(auVar53));
  auVar79 = vpermps_avx2(auVar80,auVar79);
  auVar73 = vxorps_avx512vl(auVar79,auVar81);
  auVar74 = vbroadcastss_avx512vl(auVar56);
  auVar79._4_4_ = auVar93._0_4_;
  auVar79._0_4_ = auVar93._0_4_;
  auVar79._8_4_ = auVar93._0_4_;
  auVar79._12_4_ = auVar93._0_4_;
  auVar79._16_4_ = auVar93._0_4_;
  auVar79._20_4_ = auVar93._0_4_;
  auVar79._24_4_ = auVar93._0_4_;
  auVar79._28_4_ = auVar93._0_4_;
  auVar75 = vxorps_avx512vl(auVar79,auVar81);
  auVar76 = vpermps_avx512vl(auVar77,ZEXT1632(auVar56));
  auVar79 = vpermps_avx2(auVar77,ZEXT1632(auVar93));
  auVar77 = vxorps_avx512vl(auVar79,auVar81);
  auVar78 = vpermps_avx512vl(auVar80,ZEXT1632(auVar56));
  auVar79 = vpermps_avx2(auVar80,ZEXT1632(auVar93));
  auVar79 = vxorps_avx512vl(auVar79,auVar81);
  auVar80 = vbroadcastss_avx512vl(auVar50);
  auVar81 = vbroadcastss_avx512vl(auVar49);
  pRVar31 = local_2368;
LAB_0079900a:
  bVar26 = (byte)uVar28;
  pRVar22 = (RayK<4> *)~uVar28;
  while (pRVar1 = pRVar31 + -0x10, pRVar2 = pRVar31 + -8, pRVar31 = pRVar1,
        (*(ulong *)pRVar2 & (ulong)pRVar22) != 0) {
    uVar39 = *(ulong *)pRVar1;
    uVar29 = uVar39;
    if ((uVar39 & 8) != 0) {
LAB_007991dd:
      uVar28 = (ulong)((uint)uVar39 & 0xf);
      bVar25 = bVar26;
      if (uVar28 == 8) goto LAB_007998b9;
      bVar25 = bVar26 ^ 0xf;
      auVar49 = *(undefined1 (*) [16])(ray + 0x50);
      auVar40 = *(undefined1 (*) [16])(ray + 0x50);
      pRVar22 = ray + 0x60;
      auVar46 = *(undefined1 (*) [16])pRVar22;
      auVar50 = *(undefined1 (*) [16])(ray + 0x40);
      auVar42 = *(undefined1 (*) [16])(ray + 0x40);
      auVar45 = *(undefined1 (*) [16])(ray + 0x90);
      lVar30 = (uVar39 & 0xfffffffffffffff0) + 0xc0;
      uVar39 = 0;
      goto LAB_0079929b;
    }
    while( true ) {
      auVar82 = vfmadd132ps_avx512vl(*(undefined1 (*) [32])(uVar29 + 0x40),auVar70,local_2398);
      auVar83 = vfmadd132ps_avx512vl(*(undefined1 (*) [32])(uVar29 + 0x80),auVar72,auVar71);
      auVar82 = vpmaxsd_avx2(auVar82,auVar83);
      auVar83 = vfmadd132ps_avx512vl(*(undefined1 (*) [32])(uVar29 + 0xc0),auVar73,auVar113);
      auVar83 = vpmaxsd_avx512vl(auVar83,auVar80);
      auVar82 = vpmaxsd_avx2(auVar82,auVar83);
      auVar83 = vfmadd132ps_avx512vl(*(undefined1 (*) [32])(uVar29 + 0x60),auVar75,auVar74);
      auVar84 = vfmadd132ps_avx512vl(*(undefined1 (*) [32])(uVar29 + 0xa0),auVar77,auVar76);
      auVar83 = vpminsd_avx2(auVar83,auVar84);
      auVar84 = vfmadd132ps_avx512vl(*(undefined1 (*) [32])(uVar29 + 0xe0),auVar79,auVar78);
      auVar84 = vpminsd_avx512vl(auVar84,auVar81);
      auVar98 = ZEXT3264(auVar84);
      auVar83 = vpminsd_avx2(auVar83,auVar84);
      auVar92 = ZEXT3264(auVar83);
      uVar27 = vcmpps_avx512vl(auVar82,auVar83,2);
      if ((char)uVar27 == '\0') break;
      uVar32 = 8;
      uVar34 = 0;
      do {
        lVar30 = 0;
        for (uVar39 = uVar27; (uVar39 & 1) == 0; uVar39 = uVar39 >> 1 | 0x8000000000000000) {
          lVar30 = lVar30 + 1;
        }
        uVar4 = *(undefined4 *)(uVar29 + 0x40 + lVar30 * 4);
        auVar86._4_4_ = uVar4;
        auVar86._0_4_ = uVar4;
        auVar86._8_4_ = uVar4;
        auVar86._12_4_ = uVar4;
        auVar46 = vfmadd132ps_fma(auVar86,auVar122,auVar44);
        uVar4 = *(undefined4 *)(uVar29 + 0x80 + lVar30 * 4);
        auVar89._4_4_ = uVar4;
        auVar89._0_4_ = uVar4;
        auVar89._8_4_ = uVar4;
        auVar89._12_4_ = uVar4;
        auVar42 = vfmadd132ps_fma(auVar89,auVar123,auVar41);
        uVar4 = *(undefined4 *)(uVar29 + 0xc0 + lVar30 * 4);
        auVar94._4_4_ = uVar4;
        auVar94._0_4_ = uVar4;
        auVar94._8_4_ = uVar4;
        auVar94._12_4_ = uVar4;
        auVar49 = vfmadd132ps_fma(auVar94,auVar124,auVar43);
        auVar98 = ZEXT1664(auVar49);
        uVar4 = *(undefined4 *)(uVar29 + 0x60 + lVar30 * 4);
        auVar100._4_4_ = uVar4;
        auVar100._0_4_ = uVar4;
        auVar100._8_4_ = uVar4;
        auVar100._12_4_ = uVar4;
        auVar50 = vfmadd132ps_fma(auVar100,auVar122,auVar44);
        uVar4 = *(undefined4 *)(uVar29 + 0xa0 + lVar30 * 4);
        auVar105._4_4_ = uVar4;
        auVar105._0_4_ = uVar4;
        auVar105._8_4_ = uVar4;
        auVar105._12_4_ = uVar4;
        auVar57 = vfmadd132ps_fma(auVar105,auVar123,auVar41);
        uVar4 = *(undefined4 *)(uVar29 + 0xe0 + lVar30 * 4);
        auVar110._4_4_ = uVar4;
        auVar110._0_4_ = uVar4;
        auVar110._8_4_ = uVar4;
        auVar110._12_4_ = uVar4;
        auVar51 = vfmadd132ps_fma(auVar110,auVar124,auVar43);
        auVar45 = vpminsd_avx(auVar46,auVar50);
        auVar40 = vpminsd_avx(auVar42,auVar57);
        auVar45 = vpmaxsd_avx(auVar45,auVar40);
        auVar40 = vpminsd_avx(auVar49,auVar51);
        auVar40 = vpmaxsd_avx512vl(auVar40,auVar48);
        auVar120 = ZEXT1664(auVar40);
        auVar45 = vpmaxsd_avx(auVar45,auVar40);
        auVar118 = ZEXT1664(auVar45);
        auVar40 = vpmaxsd_avx(auVar46,auVar50);
        auVar46 = vpmaxsd_avx(auVar42,auVar57);
        auVar46 = vpminsd_avx(auVar40,auVar46);
        auVar40 = vpmaxsd_avx(auVar49,auVar51);
        auVar40 = vpminsd_avx512vl(auVar40,in_ZMM21._0_16_);
        auVar92 = ZEXT1664(auVar40);
        auVar40 = vpminsd_avx(auVar46,auVar40);
        uVar37 = vpcmpd_avx512vl(auVar45,auVar40,2);
        uVar37 = uVar37 & 0xf;
        uVar39 = uVar32;
        uVar35 = uVar34;
        if (((char)uVar37 != '\0') &&
           (uVar39 = *(ulong *)(uVar29 + lVar30 * 8), uVar35 = uVar37, uVar32 != 8)) {
          *(ulong *)pRVar31 = uVar32;
          *(ulong *)(pRVar31 + 8) = uVar34;
          pRVar31 = pRVar31 + 0x10;
        }
        uVar27 = uVar27 - 1 & uVar27;
        uVar32 = uVar39;
        uVar34 = uVar35;
      } while (uVar27 != 0);
      if (uVar39 == 8) break;
      uVar29 = uVar39;
      if ((uVar39 & 8) != 0) {
        if (uVar35 == 0) goto LAB_007998e2;
        goto LAB_007991dd;
      }
    }
    if (pRVar31 == (RayK<4> *)local_2378) goto LAB_00799908;
  }
  goto LAB_007998e2;
  while( true ) {
    uVar39 = uVar39 + 1;
    lVar30 = lVar30 + 0xe0;
    if (uVar28 - 8 <= uVar39) break;
LAB_0079929b:
    uVar29 = 0;
    bVar24 = bVar25;
    while (uVar27 = (ulong)*(uint *)(lVar30 + uVar29 * 4), uVar27 != 0xffffffff) {
      uVar4 = *(undefined4 *)(lVar30 + -0xc0 + uVar29 * 4);
      auVar101._4_4_ = uVar4;
      auVar101._0_4_ = uVar4;
      auVar101._8_4_ = uVar4;
      auVar101._12_4_ = uVar4;
      fVar104 = *(float *)(lVar30 + -0xb0 + uVar29 * 4);
      auVar114._4_4_ = fVar104;
      auVar114._0_4_ = fVar104;
      auVar114._8_4_ = fVar104;
      auVar114._12_4_ = fVar104;
      auVar57 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(lVar30 + -0xa0 + uVar29 * 4)));
      uVar4 = *(undefined4 *)(lVar30 + -0x90 + uVar29 * 4);
      auVar125._4_4_ = uVar4;
      auVar125._0_4_ = uVar4;
      auVar125._8_4_ = uVar4;
      auVar125._12_4_ = uVar4;
      fVar107 = *(float *)(lVar30 + -0x80 + uVar29 * 4);
      auVar111._4_4_ = fVar107;
      auVar111._0_4_ = fVar107;
      auVar111._8_4_ = fVar107;
      auVar111._12_4_ = fVar107;
      uVar4 = *(undefined4 *)(lVar30 + -0x70 + uVar29 * 4);
      local_23a8._4_4_ = uVar4;
      local_23a8._0_4_ = uVar4;
      local_23a8._8_4_ = uVar4;
      local_23a8._12_4_ = uVar4;
      uVar4 = *(undefined4 *)(lVar30 + -0x30 + uVar29 * 4);
      auVar119._4_4_ = uVar4;
      auVar119._0_4_ = uVar4;
      auVar119._8_4_ = uVar4;
      auVar119._12_4_ = uVar4;
      auVar120 = ZEXT1664(auVar119);
      uVar4 = *(undefined4 *)(lVar30 + -0x20 + uVar29 * 4);
      auVar87._4_4_ = uVar4;
      auVar87._0_4_ = uVar4;
      auVar87._8_4_ = uVar4;
      auVar87._12_4_ = uVar4;
      uVar4 = *(undefined4 *)(lVar30 + -0x10 + uVar29 * 4);
      auVar90._4_4_ = uVar4;
      auVar90._0_4_ = uVar4;
      auVar90._8_4_ = uVar4;
      auVar90._12_4_ = uVar4;
      auVar92 = ZEXT1664(auVar90);
      auVar51 = vsubss_avx512f(auVar101,auVar125);
      auVar52 = vbroadcastss_avx512vl(auVar51);
      auVar54 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar104 - fVar107)));
      auVar55 = vsubss_avx512f(auVar57,local_23a8);
      auVar58 = vbroadcastss_avx512vl(auVar55);
      auVar59 = vsubss_avx512f(auVar119,auVar101);
      auVar60 = vbroadcastss_avx512vl(auVar59);
      auVar61 = vsubss_avx512f(auVar87,auVar114);
      auVar62 = vbroadcastss_avx512vl(auVar61);
      auVar63 = vsubss_avx512f(auVar90,auVar57);
      auVar64 = vbroadcastss_avx512vl(auVar63);
      auVar63 = vmulss_avx512f(ZEXT416((uint)(fVar104 - fVar107)),auVar63);
      auVar95._0_4_ = auVar63._0_4_;
      auVar95._4_4_ = auVar95._0_4_;
      auVar95._8_4_ = auVar95._0_4_;
      auVar95._12_4_ = auVar95._0_4_;
      auVar63 = vfmsub231ps_avx512vl(auVar95,auVar62,auVar58);
      auVar98 = ZEXT1664(auVar63);
      auVar55 = vmulss_avx512f(auVar55,auVar59);
      auVar55 = vbroadcastss_avx512vl(auVar55);
      auVar55 = vfmsub231ps_avx512vl(auVar55,auVar64,auVar52);
      auVar51 = vmulss_avx512f(auVar51,auVar61);
      auVar51 = vbroadcastss_avx512vl(auVar51);
      auVar51 = vfmsub231ps_avx512vl(auVar51,auVar60,auVar54);
      auVar59 = vsubps_avx512vl(auVar101,*(undefined1 (*) [16])ray);
      auVar61 = vsubps_avx512vl(auVar114,*(undefined1 (*) [16])(ray + 0x10));
      auVar57 = vsubps_avx512vl(auVar57,*(undefined1 (*) [16])(ray + 0x20));
      auVar65 = vmulps_avx512vl(auVar40,auVar57);
      auVar65 = vfmsub231ps_avx512vl(auVar65,auVar61,auVar46);
      auVar66 = vmulps_avx512vl(auVar46,auVar59);
      auVar66 = vfmsub231ps_avx512vl(auVar66,auVar57,auVar42);
      auVar118 = ZEXT1664(auVar66);
      auVar67 = vmulps_avx512vl(auVar42,auVar61);
      auVar67 = vfmsub231ps_avx512vl(auVar67,auVar59,auVar40);
      auVar68 = vmulps_avx512vl(auVar51,auVar46);
      auVar68 = vfmadd231ps_avx512vl(auVar68,auVar55,auVar40);
      auVar68 = vfmadd231ps_avx512vl(auVar68,auVar63,auVar42);
      auVar14._8_4_ = 0x80000000;
      auVar14._0_8_ = 0x8000000080000000;
      auVar14._12_4_ = 0x80000000;
      auVar69 = vandps_avx512vl(auVar68,auVar14);
      auVar64 = vmulps_avx512vl(auVar64,auVar67);
      auVar62 = vfmadd231ps_avx512vl(auVar64,auVar66,auVar62);
      auVar60 = vfmadd231ps_avx512vl(auVar62,auVar65,auVar60);
      auVar60 = vxorps_avx512vl(auVar69,auVar60);
      uVar12 = vcmpps_avx512vl(auVar60,ZEXT816(0) << 0x20,5);
      bVar23 = (byte)uVar12 & bVar24;
      local_24f8 = (float)*(undefined8 *)(ray + 0x30);
      fStack_24f4 = (float)((ulong)*(undefined8 *)(ray + 0x30) >> 0x20);
      fStack_24f0 = (float)*(undefined8 *)(ray + 0x38);
      fStack_24ec = (float)((ulong)*(undefined8 *)(ray + 0x38) >> 0x20);
      local_2508 = (float)*(undefined8 *)(ray + 0x80);
      fStack_2504 = (float)((ulong)*(undefined8 *)(ray + 0x80) >> 0x20);
      fStack_2500 = (float)*(undefined8 *)(ray + 0x88);
      fStack_24fc = (float)((ulong)*(undefined8 *)(ray + 0x88) >> 0x20);
      if (bVar23 != 0) {
        auVar58 = vmulps_avx512vl(auVar58,auVar67);
        auVar54 = vfmadd213ps_avx512vl(auVar54,auVar66,auVar58);
        auVar52 = vfmadd213ps_avx512vl(auVar52,auVar65,auVar54);
        auVar52 = vxorps_avx512vl(auVar69,auVar52);
        auVar118 = ZEXT864(0) << 0x20;
        uVar12 = vcmpps_avx512vl(auVar52,ZEXT816(0) << 0x20,5);
        bVar23 = bVar23 & (byte)uVar12;
        if (bVar23 != 0) {
          auVar18._8_4_ = 0x7fffffff;
          auVar18._0_8_ = 0x7fffffff7fffffff;
          auVar18._12_4_ = 0x7fffffff;
          auVar54 = vandps_avx512vl(auVar68,auVar18);
          auVar118 = ZEXT1664(auVar54);
          auVar58 = vsubps_avx512vl(auVar54,auVar60);
          uVar12 = vcmpps_avx512vl(auVar58,auVar52,5);
          bVar23 = bVar23 & (byte)uVar12;
          if (bVar23 != 0) {
            auVar57 = vmulps_avx512vl(auVar51,auVar57);
            auVar57 = vfmadd213ps_avx512vl(auVar61,auVar55,auVar57);
            auVar57 = vfmadd213ps_avx512vl(auVar59,auVar63,auVar57);
            auVar57 = vxorps_avx512vl(auVar69,auVar57);
            auVar98 = ZEXT1664(auVar57);
            auVar103._0_4_ = auVar54._0_4_ * local_24f8;
            auVar103._4_4_ = auVar54._4_4_ * fStack_24f4;
            auVar103._8_4_ = auVar54._8_4_ * fStack_24f0;
            auVar103._12_4_ = auVar54._12_4_ * fStack_24ec;
            auVar117._0_4_ = auVar54._0_4_ * local_2508;
            auVar117._4_4_ = auVar54._4_4_ * fStack_2504;
            auVar117._8_4_ = auVar54._8_4_ * fStack_2500;
            auVar117._12_4_ = auVar54._12_4_ * fStack_24fc;
            auVar118 = ZEXT1664(auVar117);
            uVar12 = vcmpps_avx512vl(auVar57,auVar117,2);
            uVar13 = vcmpps_avx512vl(auVar103,auVar57,1);
            bVar23 = bVar23 & (byte)uVar12 & (byte)uVar13;
            if (bVar23 != 0) {
              auVar98 = ZEXT864(0) << 0x20;
              uVar12 = vcmpps_avx512vl(auVar68,ZEXT816(0) << 0x20,4);
              bVar23 = bVar23 & (byte)uVar12;
              if (bVar23 != 0) {
                auVar98 = ZEXT1664(auVar45);
                uVar3 = ((context->scene->geometries).items[uVar27].ptr)->mask;
                auVar19._4_4_ = uVar3;
                auVar19._0_4_ = uVar3;
                auVar19._8_4_ = uVar3;
                auVar19._12_4_ = uVar3;
                uVar12 = vptestmd_avx512vl(auVar45,auVar19);
                bVar23 = bVar23 & (byte)uVar12 & 0xf;
                if (bVar23 != 0) {
                  bVar24 = (bVar23 ^ 0xf) & bVar24;
                }
              }
            }
          }
        }
      }
      if (bVar24 == 0) {
        bVar24 = 0;
        break;
      }
      uVar4 = *(undefined4 *)(lVar30 + -0x60 + uVar29 * 4);
      auVar96._4_4_ = uVar4;
      auVar96._0_4_ = uVar4;
      auVar96._8_4_ = uVar4;
      auVar96._12_4_ = uVar4;
      uVar4 = *(undefined4 *)(lVar30 + -0x50 + uVar29 * 4);
      auVar102._4_4_ = uVar4;
      auVar102._0_4_ = uVar4;
      auVar102._8_4_ = uVar4;
      auVar102._12_4_ = uVar4;
      uVar4 = *(undefined4 *)(lVar30 + -0x40 + uVar29 * 4);
      auVar115._4_4_ = uVar4;
      auVar115._0_4_ = uVar4;
      auVar115._8_4_ = uVar4;
      auVar115._12_4_ = uVar4;
      auVar59 = vsubps_avx512vl(auVar96,auVar119);
      auVar60 = vsubps_avx512vl(auVar102,auVar87);
      auVar61 = vsubps_avx512vl(auVar115,auVar90);
      auVar57 = vsubps_avx(auVar125,auVar96);
      auVar62 = vsubps_avx512vl(auVar111,auVar102);
      auVar63 = vsubps_avx512vl(local_23a8,auVar115);
      auVar51 = vmulps_avx512vl(auVar60,auVar63);
      auVar64 = vfmsub231ps_avx512vl(auVar51,auVar62,auVar61);
      auVar51 = vmulps_avx512vl(auVar61,auVar57);
      auVar65 = vfmsub231ps_avx512vl(auVar51,auVar63,auVar59);
      auVar92 = ZEXT1664(auVar65);
      auVar51 = vmulps_avx512vl(auVar59,auVar62);
      auVar66 = vfmsub231ps_avx512vl(auVar51,auVar57,auVar60);
      auVar51 = vsubps_avx(auVar96,*(undefined1 (*) [16])ray);
      auVar98 = ZEXT1664(auVar51);
      auVar52 = vsubps_avx(auVar102,*(undefined1 (*) [16])(ray + 0x10));
      auVar120 = ZEXT1664(auVar52);
      auVar54 = vsubps_avx(auVar115,*(undefined1 (*) [16])(ray + 0x20));
      auVar55 = vmulps_avx512vl(auVar49,auVar54);
      auVar67 = vfmsub231ps_avx512vl(auVar55,auVar52,*(undefined1 (*) [16])pRVar22);
      fVar104 = (float)*(undefined8 *)pRVar22;
      auVar116._0_4_ = fVar104 * auVar51._0_4_;
      fVar107 = (float)((ulong)*(undefined8 *)pRVar22 >> 0x20);
      auVar116._4_4_ = fVar107 * auVar51._4_4_;
      fVar108 = (float)*(undefined8 *)(ray + 0x68);
      auVar116._8_4_ = fVar108 * auVar51._8_4_;
      fVar109 = (float)((ulong)*(undefined8 *)(ray + 0x68) >> 0x20);
      auVar116._12_4_ = fVar109 * auVar51._12_4_;
      auVar58 = vfmsub231ps_avx512vl(auVar116,auVar54,auVar50);
      auVar55 = vmulps_avx512vl(auVar50,auVar52);
      auVar68 = vfmsub231ps_avx512vl(auVar55,auVar51,auVar49);
      auVar106._0_4_ = auVar66._0_4_ * fVar104;
      auVar106._4_4_ = auVar66._4_4_ * fVar107;
      auVar106._8_4_ = auVar66._8_4_ * fVar108;
      auVar106._12_4_ = auVar66._12_4_ * fVar109;
      auVar55 = vfmadd231ps_fma(auVar106,auVar65,auVar49);
      auVar55 = vfmadd231ps_avx512vl(auVar55,auVar64,auVar50);
      auVar15._8_4_ = 0x80000000;
      auVar15._0_8_ = 0x8000000080000000;
      auVar15._12_4_ = 0x80000000;
      auVar69 = vandps_avx512vl(auVar55,auVar15);
      auVar63 = vmulps_avx512vl(auVar63,auVar68);
      auVar62 = vfmadd231ps_avx512vl(auVar63,auVar58,auVar62);
      auVar57 = vfmadd231ps_avx512vl(auVar62,auVar67,auVar57);
      auVar57 = vxorps_avx512vl(auVar69,auVar57);
      uVar12 = vcmpps_avx512vl(auVar57,ZEXT816(0) << 0x20,5);
      bVar23 = (byte)uVar12 & bVar24;
      if (bVar23 == 0) {
LAB_00799554:
        auVar118 = ZEXT1664(auVar58);
      }
      else {
        auVar61 = vmulps_avx512vl(auVar61,auVar68);
        auVar58 = vfmadd213ps_avx512vl(auVar60,auVar58,auVar61);
        auVar58 = vfmadd213ps_avx512vl(auVar59,auVar67,auVar58);
        auVar59 = vxorps_avx512vl(auVar69,auVar58);
        auVar58 = ZEXT816(0) << 0x20;
        uVar12 = vcmpps_avx512vl(auVar59,auVar58,5);
        bVar23 = bVar23 & (byte)uVar12;
        if (bVar23 == 0) goto LAB_00799554;
        auVar16._8_4_ = 0x7fffffff;
        auVar16._0_8_ = 0x7fffffff7fffffff;
        auVar16._12_4_ = 0x7fffffff;
        auVar58 = vandps_avx512vl(auVar55,auVar16);
        auVar118 = ZEXT1664(auVar58);
        auVar57 = vsubps_avx512vl(auVar58,auVar57);
        uVar12 = vcmpps_avx512vl(auVar57,auVar59,5);
        bVar23 = bVar23 & (byte)uVar12;
        if (bVar23 != 0) {
          auVar112._0_4_ = auVar66._0_4_ * auVar54._0_4_;
          auVar112._4_4_ = auVar66._4_4_ * auVar54._4_4_;
          auVar112._8_4_ = auVar66._8_4_ * auVar54._8_4_;
          auVar112._12_4_ = auVar66._12_4_ * auVar54._12_4_;
          auVar57 = vfmadd213ps_fma(auVar52,auVar65,auVar112);
          auVar120 = ZEXT1664(auVar57);
          auVar57 = vfmadd213ps_fma(auVar51,auVar64,auVar57);
          auVar88._0_4_ = auVar69._0_4_ ^ auVar57._0_4_;
          auVar88._4_4_ = auVar69._4_4_ ^ auVar57._4_4_;
          auVar88._8_4_ = auVar69._8_4_ ^ auVar57._8_4_;
          auVar88._12_4_ = auVar69._12_4_ ^ auVar57._12_4_;
          auVar91._0_4_ = auVar58._0_4_ * local_24f8;
          auVar91._4_4_ = auVar58._4_4_ * fStack_24f4;
          auVar91._8_4_ = auVar58._8_4_ * fStack_24f0;
          auVar91._12_4_ = auVar58._12_4_ * fStack_24ec;
          auVar92 = ZEXT1664(auVar91);
          auVar97._0_4_ = auVar58._0_4_ * local_2508;
          auVar97._4_4_ = auVar58._4_4_ * fStack_2504;
          auVar97._8_4_ = auVar58._8_4_ * fStack_2500;
          auVar97._12_4_ = auVar58._12_4_ * fStack_24fc;
          auVar98 = ZEXT1664(auVar97);
          uVar12 = vcmpps_avx512vl(auVar88,auVar97,2);
          uVar13 = vcmpps_avx512vl(auVar91,auVar88,1);
          bVar23 = bVar23 & (byte)uVar12 & (byte)uVar13;
          if (bVar23 != 0) {
            uVar12 = vcmpps_avx512vl(auVar55,ZEXT816(0) << 0x20,4);
            bVar23 = bVar23 & (byte)uVar12;
            if (bVar23 != 0) {
              uVar3 = ((context->scene->geometries).items[uVar27].ptr)->mask;
              auVar17._4_4_ = uVar3;
              auVar17._0_4_ = uVar3;
              auVar17._8_4_ = uVar3;
              auVar17._12_4_ = uVar3;
              uVar12 = vptestmd_avx512vl(auVar45,auVar17);
              bVar23 = bVar23 & (byte)uVar12 & 0xf;
              if (bVar23 != 0) {
                bVar24 = (bVar23 ^ 0xf) & bVar24;
              }
            }
          }
        }
      }
      if ((bVar24 == 0) || (bVar36 = 2 < uVar29, uVar29 = uVar29 + 1, bVar36)) break;
    }
    bVar25 = bVar25 & bVar24;
    if (bVar25 == 0) break;
  }
  bVar25 = bVar25 ^ 0xf;
LAB_007998b9:
  bVar25 = bVar25 | bVar26;
  uVar28 = (ulong)bVar25;
  bVar26 = (byte)local_267c & ~bVar25;
  pRVar22 = (RayK<4> *)0x0;
  if (bVar26 == 0) goto LAB_00799908;
  local_267c = (uint)bVar26;
  auVar45 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
  bVar36 = (bool)(bVar25 >> 1 & 1);
  bVar6 = (bool)(bVar25 >> 2 & 1);
  in_ZMM21 = ZEXT1664(CONCAT412((uint)(bVar25 >> 3) * auVar45._12_4_ |
                                (uint)!(bool)(bVar25 >> 3) * in_ZMM21._12_4_,
                                CONCAT48((uint)bVar6 * auVar45._8_4_ | (uint)!bVar6 * in_ZMM21._8_4_
                                         ,CONCAT44((uint)bVar36 * auVar45._4_4_ |
                                                   (uint)!bVar36 * in_ZMM21._4_4_,
                                                   (uint)(bVar25 & 1) * auVar45._0_4_ |
                                                   (uint)!(bool)(bVar25 & 1) * in_ZMM21._0_4_))));
LAB_007998e2:
  pRVar22 = (RayK<4> *)local_2378;
  if (pRVar31 == pRVar22) goto LAB_00799908;
  goto LAB_0079900a;
LAB_00799908:
  in_ZMM17 = ZEXT3264(auVar70);
  in_ZMM16 = ZEXT3264(auVar71);
  in_ZMM15 = ZEXT3264(local_2398);
  auVar121 = ZEXT3264(auVar113);
  if (uVar38 == 0) {
    bVar33 = (byte)uVar28 & bVar33;
    bVar36 = (bool)(bVar33 >> 1 & 1);
    bVar6 = (bool)(bVar33 >> 2 & 1);
    *(uint *)(ray + 0x80) =
         (uint)(bVar33 & 1) * -0x800000 | (uint)!(bool)(bVar33 & 1) * *(int *)(ray + 0x80);
    *(uint *)(ray + 0x84) = (uint)bVar36 * -0x800000 | (uint)!bVar36 * *(int *)(ray + 0x84);
    *(uint *)(ray + 0x88) = (uint)bVar6 * -0x800000 | (uint)!bVar6 * *(int *)(ray + 0x88);
    *(uint *)(ray + 0x8c) =
         (uint)(bVar33 >> 3) * -0x800000 | (uint)!(bool)(bVar33 >> 3) * *(int *)(ray + 0x8c);
    return;
  }
  goto LAB_00798c3a;
}

Assistant:

__forceinline vboolf4 operator !=(const vint4& a, const vint4& b) { return _mm_cmp_epi32_mask(a,b,_MM_CMPINT_NE); }